

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2InitDefaultSAXHandler(xmlSAXHandler *hdlr,int warning)

{
  int warning_local;
  xmlSAXHandler *hdlr_local;
  
  if ((hdlr != (xmlSAXHandler *)0x0) && (hdlr->initialized == 0)) {
    xmlSAXVersion(hdlr,xmlSAX2DefaultVersionValue);
    if (warning == 0) {
      hdlr->warning = (warningSAXFunc)0x0;
    }
    else {
      hdlr->warning = xmlParserWarning;
    }
  }
  return;
}

Assistant:

void
xmlSAX2InitDefaultSAXHandler(xmlSAXHandler *hdlr, int warning)
{
    if ((hdlr == NULL) || (hdlr->initialized != 0))
	return;

    xmlSAXVersion(hdlr, xmlSAX2DefaultVersionValue);
    if (warning == 0)
	hdlr->warning = NULL;
    else
	hdlr->warning = xmlParserWarning;
}